

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

Variable * __thiscall
soul::BlockBuilder::createVariable<soul::Identifier>
          (BlockBuilder *this,Type *type,Identifier *name,Role role)

{
  Module *m;
  Variable *pVVar1;
  Type local_28;
  
  m = this->module;
  local_28.category = type->category;
  local_28.arrayElementCategory = type->arrayElementCategory;
  local_28.isRef = type->isRef;
  local_28.isConstant = type->isConstant;
  local_28.primitiveType.type = (type->primitiveType).type;
  local_28.boundingSize = type->boundingSize;
  local_28.arrayElementBoundingSize = type->arrayElementBoundingSize;
  local_28.structure.object = (type->structure).object;
  (type->structure).object = (Structure *)0x0;
  pVVar1 = createVariable<soul::Identifier>(m,&local_28,name,role);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_28.structure);
  return pVVar1;
}

Assistant:

heart::Variable& createVariable (Type type, StringType&& name, heart::Variable::Role role)
    {
        return createVariable (module, std::move (type), std::move (name), role);
    }